

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::SkipWhitespace(AsciiParser *this)

{
  ulong uVar1;
  int *piVar2;
  byte bVar3;
  StreamReader *pSVar4;
  uint8_t *puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  
  pSVar4 = this->_sr;
  uVar8 = pSVar4->length_;
  uVar7 = pSVar4->idx_;
  if (uVar7 < uVar8) {
    puVar5 = pSVar4->binary_;
    iVar9 = (this->_curr_cursor).col;
    uVar6 = uVar7;
    do {
      iVar9 = iVar9 + 1;
      bVar3 = puVar5[uVar6];
      uVar7 = uVar6;
      if (bVar3 == 0) break;
      uVar1 = uVar6 + 1;
      pSVar4->idx_ = uVar1;
      (this->_curr_cursor).col = iVar9;
      if ((0x20 < bVar3) || ((0x100001200U >> ((ulong)(uint)bVar3 & 0x3f) & 1) == 0)) {
        uVar7 = uVar6 + 1;
        break;
      }
      uVar7 = uVar8;
      uVar6 = uVar1;
    } while (uVar8 != uVar1);
    uVar8 = pSVar4->length_;
  }
  uVar6 = uVar7 - 1;
  if (uVar6 <= uVar8 && 0 < (long)uVar7) {
    pSVar4->idx_ = uVar6;
    piVar2 = &(this->_curr_cursor).col;
    *piVar2 = *piVar2 + -1;
  }
  return uVar6 <= uVar8 && 0 < (long)uVar7;
}

Assistant:

bool AsciiParser::SkipWhitespace() {
  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }
    _curr_cursor.col++;

    if ((c == ' ') || (c == '\t') || (c == '\f')) {
      // continue
    } else {
      break;
    }
  }

  // unwind 1 char
  if (!_sr->seek_from_current(-1)) {
    return false;
  }
  _curr_cursor.col--;

  return true;
}